

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brake.hpp
# Opt level: O1

void __thiscall ruckig::BrakeProfile::finalize(BrakeProfile *this,double *ps,double *vs,double *as)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = (this->t)._M_elems[0];
  if ((0.0 < dVar1) || (0.0 < (this->t)._M_elems[1])) {
    this->duration = dVar1;
    (this->p)._M_elems[0] = *ps;
    (this->v)._M_elems[0] = *vs;
    (this->a)._M_elems[0] = *as;
    dVar2 = *vs;
    dVar3 = *as;
    dVar4 = (this->j)._M_elems[0] * dVar1;
    *ps = ((dVar4 / 6.0 + dVar3 * 0.5) * dVar1 + dVar2) * dVar1 + *ps;
    *vs = (dVar4 * 0.5 + dVar3) * dVar1 + dVar2;
    *as = dVar4 + dVar3;
    dVar1 = (this->t)._M_elems[1];
    if (0.0 < dVar1) {
      this->duration = this->duration + dVar1;
      (this->p)._M_elems[1] = *ps;
      (this->v)._M_elems[1] = *vs;
      (this->a)._M_elems[1] = *as;
      dVar2 = *vs;
      dVar3 = *as;
      dVar4 = (this->j)._M_elems[1] * dVar1;
      *ps = ((dVar4 / 6.0 + dVar3 * 0.5) * dVar1 + dVar2) * dVar1 + *ps;
      *vs = (dVar4 * 0.5 + dVar3) * dVar1 + dVar2;
      *as = dVar4 + dVar3;
      return;
    }
  }
  else {
    this->duration = 0.0;
  }
  return;
}

Assistant:

void finalize(double& ps, double& vs, double& as) {
        if (t[0] <= 0.0 && t[1] <= 0.0) {
            duration = 0.0;
            return;
        }

        duration = t[0];
        p[0] = ps;
        v[0] = vs;
        a[0] = as;
        std::tie(ps, vs, as) = integrate(t[0], ps, vs, as, j[0]);

        if (t[1] > 0.0) {
            duration += t[1];
            p[1] = ps;
            v[1] = vs;
            a[1] = as;
            std::tie(ps, vs, as) = integrate(t[1], ps, vs, as, j[1]);
        }
    }